

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O2

ssize_t __thiscall
avro::anon_unknown_3::FileBufferCopyOut::write
          (FileBufferCopyOut *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  Exception *this_00;
  int *piVar2;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  undefined4 in_register_00000034;
  char *local_100;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  
  sVar1 = ::write(this->fd_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  if (-1 < sVar1) {
    return sVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f8,"Cannot write file: %1%");
  piVar2 = __errno_location();
  local_100 = strerror(*piVar2);
  msg = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,char*const&>
                  (&local_f8,&local_100);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void write(const uint8_t* b, size_t len) {
        if (::write(fd_, b, len) < 0) {
            throw Exception(boost::format("Cannot write file: %1%") %
                ::strerror(errno));
        }
    }